

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

bool __thiscall spv::Builder::isConstantOpCode(Builder *this,Op opcode)

{
  return (bool)((byte)(0x1f7e0000000002 >> ((byte)opcode & 0x3f)) &
               opcode < (OpSpecConstantOp|OpUndef));
}

Assistant:

bool Builder::isConstantOpCode(Op opcode) const
{
    switch (opcode) {
    case OpUndef:
    case OpConstantTrue:
    case OpConstantFalse:
    case OpConstant:
    case OpConstantComposite:
    case OpConstantSampler:
    case OpConstantNull:
    case OpSpecConstantTrue:
    case OpSpecConstantFalse:
    case OpSpecConstant:
    case OpSpecConstantComposite:
    case OpSpecConstantOp:
        return true;
    default:
        return false;
    }
}